

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_A_FreezeDeath(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  ulong uVar2;
  VM_UBYTE VVar3;
  undefined8 *puVar4;
  player_t *ppVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  PClass *pPVar10;
  AActor *ent;
  char *__assertion;
  bool bVar11;
  FSoundID local_2c;
  undefined4 extraout_var_00;
  
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00602960;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0060272a:
        ent = (AActor *)0x0;
      }
      else {
        pPVar9 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar9 == (PClass *)0x0) {
          iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar9 = (PClass *)CONCAT44(extraout_var,iVar6);
          (ent->super_DThinker).super_DObject.Class = pPVar9;
        }
        bVar11 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar10 && bVar11) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar11 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar10) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00602960;
        }
      }
      pPVar10 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_006027ea;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_00602950;
        puVar4 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar4 != (undefined8 *)0x0) {
            pPVar9 = (PClass *)puVar4[1];
            if (pPVar9 == (PClass *)0x0) {
              pPVar9 = (PClass *)(**(code **)*puVar4)(puVar4);
              puVar4[1] = pPVar9;
            }
            bVar11 = pPVar9 != (PClass *)0x0;
            if (pPVar9 != pPVar10 && bVar11) {
              do {
                pPVar9 = pPVar9->ParentClass;
                bVar11 = pPVar9 != (PClass *)0x0;
                if (pPVar9 == pPVar10) break;
              } while (pPVar9 != (PClass *)0x0);
            }
            if (!bVar11) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00602960;
            }
          }
        }
        else if (puVar4 != (undefined8 *)0x0) goto LAB_00602950;
      }
      if (((numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_006027ea:
        uVar7 = FRandom::GenRand32(&pr_freezedeath);
        uVar8 = FRandom::GenRand32(&pr_freezedeath);
        ent->tics = (uVar8 & 0xff) + (uVar7 & 0xff) + 0x4b;
        uVar2._0_4_ = ent->flags;
        uVar2._4_4_ = ent->flags2;
        ent->flags = (ActorFlags)(int)(uVar2 | 0x4160080080006);
        ent->flags2 = (ActorFlags2)(int)((uVar2 | 0x4160080080006) >> 0x20);
        pbVar1 = (byte *)((long)&(ent->flags3).Value + 2);
        *pbVar1 = *pbVar1 | 0x20;
        pPVar10 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar10 == (PClass *)0x0) {
          iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar10 = (PClass *)CONCAT44(extraout_var_00,iVar6);
          (ent->super_DThinker).super_DObject.Class = pPVar10;
        }
        ent->Height = *(double *)(pPVar10->Defaults + 0x160);
        if (((ent->RenderStyle).field_0.BlendOp & 0xfc) == 4) {
          ent->RenderStyle = LegacyRenderStyles[1];
        }
        local_2c.ID = S_FindSound("misc/freeze");
        S_Sound(ent,4,&local_2c,1.0,1.0);
        if (((ent->flags).Value & 0x40000000) != 0) {
          ent->Alpha = 1.0;
          ent->visdir = '\0';
        }
        ppVar5 = ent->player;
        if (ppVar5 == (player_t *)0x0) {
          if ((((ent->flags3).Value & 0x2000) != 0) && (ent->special != 0)) {
            P_ExecuteSpecial(ent->special,(line_t *)0x0,ent,false,ent->args[0],ent->args[1],
                             ent->args[2],ent->args[3],ent->args[4]);
            ent->special = 0;
          }
        }
        else {
          ppVar5->damagecount = 0;
          ppVar5->bonuscount = 0;
          ppVar5->poisoncount = 0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00602960;
    }
    if (ent == (AActor *)0x0) goto LAB_0060272a;
  }
LAB_00602950:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00602960:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_ACTION_PROLOGUE;

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}